

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view.cc
# Opt level: O2

int gimage::getViewImageName(string *image,char *name,char *spath,bool verbose)

{
  _Rb_tree_header *p_Var1;
  pointer pbVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  ImageIO *pIVar6;
  _Base_ptr p_Var7;
  ostream *poVar8;
  ulong uVar9;
  ulong uVar10;
  iterator iVar11;
  undefined8 uVar12;
  undefined7 in_register_00000009;
  string *psVar13;
  string *psVar14;
  long lVar15;
  long lVar16;
  char cVar17;
  long lVar18;
  string *psVar19;
  string *psVar20;
  size_t i;
  ulong uVar21;
  long lVar22;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  ulong local_2b8;
  allocator local_2aa;
  allocator local_2a9;
  ulong local_2a8;
  string *local_2a0;
  string *local_298;
  undefined4 local_28c;
  allocator_type local_286;
  allocator local_285;
  allocator local_284;
  allocator local_283;
  allocator local_282;
  allocator local_281;
  char *local_280;
  int dd_1;
  int dd;
  undefined4 uStack_26c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  list;
  long h;
  size_type local_240;
  long dh;
  long w;
  string s;
  string depthname;
  int d;
  undefined4 uStack_18c;
  long h_1;
  long local_150;
  long local_148;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  flist;
  string local_f0 [32];
  string local_d0 [32];
  string local_b0 [32];
  string local_90 [32];
  string local_70 [32];
  long dw;
  
  local_28c = (undefined4)CONCAT71(in_register_00000009,verbose);
  list.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  list.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  list.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_298 = image;
  std::__cxx11::string::string((string *)&flist,name,(allocator *)&depthname);
  local_280 = spath;
  gutil::split((vector *)&list,(string *)&flist,',',true);
  std::__cxx11::string::~string((string *)&flist);
  local_298->_M_string_length = 0;
  *(local_298->_M_dataplus)._M_p = '\0';
  local_2b8 = 0;
  lVar15 = 0x20;
  for (uVar21 = 1;
      uVar21 < (ulong)((long)list.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)list.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 5); uVar21 = uVar21 + 1) {
    iVar5 = std::__cxx11::string::compare
                      ((long)&((list.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                       lVar15,0,(char *)0x2);
    if (iVar5 == 0) {
      std::__cxx11::string::substr
                ((ulong)&flist,
                 (long)&((list.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar15);
      std::__cxx11::string::operator=((string *)local_298,(string *)&flist);
      std::__cxx11::string::~string((string *)&flist);
      local_2b8 = 1;
    }
    lVar15 = lVar15 + 0x20;
  }
  if (local_298->_M_string_length == 0) {
    std::__cxx11::string::string
              ((string *)&depthname,
               (string *)
               list.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
    lVar15 = std::__cxx11::string::find_last_of((char *)&depthname,0x12d5b3);
    if (8 < (ulong)(CONCAT44(depthname._M_string_length._4_4_,(undefined4)depthname._M_string_length
                            ) - (lVar15 + 1))) {
      std::__cxx11::string::substr((ulong)&flist,(ulong)&depthname);
      bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &flist,"disp");
      std::__cxx11::string::~string((string *)&flist);
      if (bVar3) {
        pIVar6 = getImageIO();
        ImageIO::loadHeader(pIVar6,depthname._M_dataplus._M_p,&dw,&dh,&dd);
        p_Var1 = &flist._M_t._M_impl.super__Rb_tree_header;
        flist._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        flist._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        flist._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        flist._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
        flist._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
        std::__cxx11::string::substr((ulong)&d,(ulong)&depthname);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&h,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&d,"im")
        ;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&w,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&h,
                       depthname._M_dataplus._M_p[lVar15 + 5]);
        std::operator+(&s,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&w,
                       ".");
        std::__cxx11::string::string((string *)&h_1,"",(allocator *)&dd_1);
        gutil::getFileList((set *)&flist,(string *)&s,(string *)&h_1);
        std::__cxx11::string::~string((string *)&h_1);
        std::__cxx11::string::~string((string *)&s);
        std::__cxx11::string::~string((string *)&w);
        std::__cxx11::string::~string((string *)&h);
        std::__cxx11::string::~string((string *)&d);
        for (p_Var7 = flist._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var7 != p_Var1; p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7)
            ) {
          std::__cxx11::string::string((string *)&s,(string *)(p_Var7 + 1));
          pIVar6 = getImageIO();
          ImageIO::loadHeader(pIVar6,s._M_dataplus._M_p,&w,&h,&d);
          uVar21 = (w + dw + -1) / dw;
          lVar15 = (long)(int)uVar21;
          if (((w + lVar15 + -1) / lVar15 == dw) && ((h + lVar15 + -1) / lVar15 == dh)) {
            if ((char)local_28c != '\0') {
              poVar8 = std::operator<<((ostream *)&std::cout,"Found suitable image: ");
              poVar8 = std::operator<<(poVar8,(string *)&s);
              std::endl<char,std::char_traits<char>>(poVar8);
            }
            if (dd == 1) {
              std::__cxx11::string::_M_assign((string *)local_298);
              dd = d;
              local_2b8 = uVar21;
            }
          }
          std::__cxx11::string::~string((string *)&s);
        }
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~_Rb_tree(&flist._M_t);
      }
    }
    std::__cxx11::string::~string((string *)&depthname);
    if (local_298->_M_string_length == 0) {
      std::__cxx11::string::string
                ((string *)&w,
                 (string *)
                 list.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start);
      uVar21 = std::__cxx11::string::rfind((char)&w,0x3a);
      if (uVar21 == 0xffffffffffffffff) {
        bVar3 = false;
      }
      else {
        iVar5 = std::__cxx11::string::compare((ulong)&w,uVar21,(char *)0x2);
        bVar3 = iVar5 != 0;
      }
      pIVar6 = getImageIO();
      ImageIO::loadHeader(pIVar6,(char *)w,&dh,(long *)&dd,&dd_1);
      dd_1 = 0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear(&list);
      getPrefixAlternatives(&list,(string *)&w,local_280);
      local_280 = (char *)CONCAT44(local_280._4_4_,0xffffffff);
      uVar21 = 0;
      while( true ) {
        pbVar2 = list.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (((ulong)((long)list.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)list.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar21) ||
           (local_298->_M_string_length != 0)) break;
        depthname._M_string_length._0_4_ = 0;
        depthname.field_2._M_allocated_capacity = 0;
        depthname.field_2._8_8_ = &depthname._M_string_length;
        std::__cxx11::string::string((string *)&flist,"",(allocator *)&s);
        gutil::getFileList((set *)&depthname,(string *)(pbVar2 + uVar21),(string *)&flist);
        std::__cxx11::string::~string((string *)&flist);
        s._M_string_length._0_4_ = 0;
        s.field_2._M_allocated_capacity = 0;
        s.field_2._8_8_ = &s._M_string_length;
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&s,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&w);
        for (uVar12 = depthname.field_2._8_8_; (size_type *)uVar12 != &depthname._M_string_length;
            uVar12 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar12)) {
          std::__cxx11::string::string((string *)&h,(string *)(uVar12 + 0x20));
          if (bVar3) {
            std::__cxx11::string::find_last_of((char *)&h,0x12d5b3);
            cVar17 = (char)(string *)&h;
            uVar9 = std::__cxx11::string::find(cVar17,0x5f);
            if ((uVar9 != 0xffffffffffffffff) &&
               (uVar10 = std::__cxx11::string::rfind(cVar17,0x5f), uVar9 < uVar10)) {
              std::__cxx11::string::substr((ulong)&h_1,(ulong)&h);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&d
                             ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &h_1,":");
              std::__cxx11::string::substr((ulong)&dw,(ulong)&h);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &flist,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&d,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &dw);
              std::__cxx11::string::operator=((string *)&h,(string *)&flist);
              std::__cxx11::string::~string((string *)&flist);
              std::__cxx11::string::~string((string *)&dw);
              std::__cxx11::string::~string((string *)&d);
              std::__cxx11::string::~string((string *)&h_1);
            }
          }
          iVar11 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&s,(key_type *)&h);
          if (((iVar11._M_node == (_Base_ptr)&s._M_string_length) &&
              (iVar5 = std::__cxx11::string::compare((ulong)&h,local_240 - 4,(char *)0x4),
              iVar5 != 0)) &&
             (iVar5 = std::__cxx11::string::compare((ulong)&h,local_240 - 4,(char *)0x4), iVar5 != 0
             )) {
            std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string_const&>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)&s,(key_type *)&h);
            pIVar6 = getImageIO();
            ImageIO::loadHeader(pIVar6,(char *)h,(long *)&d,&h_1,(int *)&dw);
            uVar9 = (CONCAT44(uStack_18c,d) + dh + -1) / dh;
            lVar15 = (long)(int)uVar9;
            if (((CONCAT44(uStack_18c,d) + lVar15 + -1) / lVar15 == dh) &&
               ((h_1 + lVar15 + -1) / lVar15 == CONCAT44(uStack_26c,dd))) {
              if ((char)local_28c != '\0') {
                poVar8 = std::operator<<((ostream *)&std::cout,"Found suitable image: ");
                poVar8 = std::operator<<(poVar8,(string *)&h);
                std::endl<char,std::char_traits<char>>(poVar8);
              }
              std::__cxx11::string::substr((ulong)&local_150,(ulong)&h);
              lVar22 = local_148;
              lVar15 = local_150;
              local_2a8 = uVar9;
              for (lVar18 = 0; lVar22 != lVar18; lVar18 = lVar18 + 1) {
                iVar5 = tolower((int)*(char *)(lVar15 + lVar18));
                *(char *)(lVar15 + lVar18) = (char)iVar5;
              }
              if (((anonymous_namespace)::getTextureNameRating(std::__cxx11::string)::
                   whitelist_abi_cxx11_ == '\0') &&
                 (iVar5 = __cxa_guard_acquire(&(anonymous_namespace)::
                                               getTextureNameRating(std::__cxx11::string)::
                                               whitelist_abi_cxx11_), iVar5 != 0)) {
                std::__cxx11::string::string((string *)&flist,"intensity",&local_2a9);
                std::__cxx11::string::string
                          ((string *)&flist._M_t._M_impl.super__Rb_tree_header._M_header._M_right,
                           "img",&local_2aa);
                std::__cxx11::string::string(local_f0,"image",&local_281);
                std::__cxx11::string::string(local_d0,"mono",&local_282);
                std::__cxx11::string::string(local_b0,"color",&local_283);
                std::__cxx11::string::string(local_90,"rgb",&local_284);
                std::__cxx11::string::string(local_70,"left",&local_285);
                __l._M_len = 7;
                __l._M_array = (iterator)&flist;
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&(anonymous_namespace)::getTextureNameRating(std::__cxx11::string)::
                             whitelist_abi_cxx11_,__l,&local_286);
                lVar15 = 0xc0;
                do {
                  std::__cxx11::string::~string((string *)(&flist._M_t._M_impl.field_0x0 + lVar15));
                  lVar15 = lVar15 + -0x20;
                } while (lVar15 != -0x20);
                __cxa_atexit(std::
                             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ::~vector,
                             &(anonymous_namespace)::getTextureNameRating(std::__cxx11::string)::
                              whitelist_abi_cxx11_,&__dso_handle);
                __cxa_guard_release(&(anonymous_namespace)::
                                     getTextureNameRating(std::__cxx11::string)::
                                     whitelist_abi_cxx11_);
              }
              if (((anonymous_namespace)::getTextureNameRating(std::__cxx11::string)::
                   blacklist_abi_cxx11_ == '\0') &&
                 (iVar5 = __cxa_guard_acquire(&(anonymous_namespace)::
                                               getTextureNameRating(std::__cxx11::string)::
                                               blacklist_abi_cxx11_), iVar5 != 0)) {
                std::__cxx11::string::string((string *)&flist,"right",&local_2a9);
                __l_00._M_len = 1;
                __l_00._M_array = (iterator)&flist;
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&(anonymous_namespace)::getTextureNameRating(std::__cxx11::string)::
                             blacklist_abi_cxx11_,__l_00,(allocator_type *)&local_2aa);
                std::__cxx11::string::~string((string *)&flist);
                __cxa_atexit(std::
                             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ::~vector,
                             &(anonymous_namespace)::getTextureNameRating(std::__cxx11::string)::
                              blacklist_abi_cxx11_,&__dso_handle);
                __cxa_guard_release(&(anonymous_namespace)::
                                     getTextureNameRating(std::__cxx11::string)::
                                     blacklist_abi_cxx11_);
              }
              flist._M_t._M_impl._0_8_ = &local_150;
              local_2a0 = DAT_00138e98;
              lVar22 = (long)DAT_00138e98 -
                       (long)(anonymous_namespace)::getTextureNameRating(std::__cxx11::string)::
                             blacklist_abi_cxx11_;
              psVar19 = (anonymous_namespace)::getTextureNameRating(std::__cxx11::string)::
                        blacklist_abi_cxx11_;
              for (lVar15 = lVar22 >> 7; uVar9 = local_2a8, psVar20 = psVar19, 0 < lVar15;
                  lVar15 = lVar15 + -1) {
                bVar4 = __gnu_cxx::__ops::
                        _Iter_pred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/roboception[P]cvkit/gimage/view.cc:601:32)>
                        ::anon_class_8_1_898f2789_for__M_pred::operator()
                                  ((anon_class_8_1_898f2789_for__M_pred *)&flist,psVar19);
                uVar9 = local_2a8;
                psVar13 = local_2a0;
                if (bVar4) goto LAB_001202e6;
                bVar4 = __gnu_cxx::__ops::
                        _Iter_pred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/roboception[P]cvkit/gimage/view.cc:601:32)>
                        ::anon_class_8_1_898f2789_for__M_pred::operator()
                                  ((anon_class_8_1_898f2789_for__M_pred *)&flist,psVar19 + 1);
                psVar20 = psVar19 + 1;
                uVar9 = local_2a8;
                psVar13 = local_2a0;
                if (bVar4) goto LAB_001202e6;
                bVar4 = __gnu_cxx::__ops::
                        _Iter_pred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/roboception[P]cvkit/gimage/view.cc:601:32)>
                        ::anon_class_8_1_898f2789_for__M_pred::operator()
                                  ((anon_class_8_1_898f2789_for__M_pred *)&flist,psVar19 + 2);
                psVar20 = psVar19 + 2;
                uVar9 = local_2a8;
                psVar13 = local_2a0;
                if (bVar4) goto LAB_001202e6;
                bVar4 = __gnu_cxx::__ops::
                        _Iter_pred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/roboception[P]cvkit/gimage/view.cc:601:32)>
                        ::anon_class_8_1_898f2789_for__M_pred::operator()
                                  ((anon_class_8_1_898f2789_for__M_pred *)&flist,psVar19 + 3);
                psVar20 = psVar19 + 3;
                uVar9 = local_2a8;
                psVar13 = local_2a0;
                if (bVar4) goto LAB_001202e6;
                psVar19 = psVar19 + 4;
                lVar22 = lVar22 + -0x80;
              }
              lVar22 = lVar22 >> 5;
              psVar13 = local_2a0;
              if (lVar22 == 1) {
LAB_0012048f:
                bVar4 = __gnu_cxx::__ops::
                        _Iter_pred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/roboception[P]cvkit/gimage/view.cc:601:32)>
                        ::anon_class_8_1_898f2789_for__M_pred::operator()
                                  ((anon_class_8_1_898f2789_for__M_pred *)&flist,psVar19);
                psVar20 = psVar19;
                if (!bVar4) {
                  psVar20 = psVar13;
                }
LAB_001202e6:
                iVar5 = 0;
                if (psVar20 == psVar13) goto LAB_001202f2;
              }
              else {
                if (lVar22 == 2) {
LAB_00120472:
                  psVar13 = local_2a0;
                  bVar4 = __gnu_cxx::__ops::
                          _Iter_pred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/roboception[P]cvkit/gimage/view.cc:601:32)>
                          ::anon_class_8_1_898f2789_for__M_pred::operator()
                                    ((anon_class_8_1_898f2789_for__M_pred *)&flist,psVar19);
                  psVar20 = psVar19;
                  if (!bVar4) {
                    psVar19 = psVar19 + 1;
                    goto LAB_0012048f;
                  }
                  goto LAB_001202e6;
                }
                if (lVar22 == 3) {
                  bVar4 = __gnu_cxx::__ops::
                          _Iter_pred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/roboception[P]cvkit/gimage/view.cc:601:32)>
                          ::anon_class_8_1_898f2789_for__M_pred::operator()
                                    ((anon_class_8_1_898f2789_for__M_pred *)&flist,psVar19);
                  psVar13 = local_2a0;
                  if (!bVar4) {
                    psVar19 = psVar19 + 1;
                    goto LAB_00120472;
                  }
                  goto LAB_001202e6;
                }
LAB_001202f2:
                lVar15 = DAT_00138e78;
                psVar19 = (anonymous_namespace)::getTextureNameRating(std::__cxx11::string)::
                          whitelist_abi_cxx11_;
                flist._M_t._M_impl._0_8_ = &local_150;
                local_2a0 = (string *)
                            (DAT_00138e78 -
                            (long)(anonymous_namespace)::getTextureNameRating(std::__cxx11::string)
                                  ::whitelist_abi_cxx11_);
                lVar22 = 0;
                lVar18 = ((long)local_2a0 >> 7) + 1;
                do {
                  lVar16 = lVar22;
                  if (lVar18 + -1 == 0 || lVar18 < 1) {
                    psVar20 = (string *)(lVar15 + lVar16);
                    lVar22 = (long)&(local_2a0->_M_dataplus)._M_p + lVar16 >> 5;
                    uVar9 = local_2a8;
                    if (lVar22 != 1) {
                      if (lVar22 == 3) {
                        psVar14 = (string *)(lVar16 + -0x20 + lVar15);
                        bVar4 = __gnu_cxx::__ops::
                                _Iter_pred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/roboception[P]cvkit/gimage/view.cc:601:32)>
                                ::anon_class_8_1_898f2789_for__M_pred::operator()
                                          ((anon_class_8_1_898f2789_for__M_pred *)&flist,psVar14);
                        uVar9 = local_2a8;
                        psVar13 = psVar20;
                        if (bVar4) goto LAB_00120409;
                        psVar20 = psVar14;
                        psVar14 = (string *)(lVar16 + -0x20 + lVar15);
                      }
                      else {
                        psVar13 = psVar19;
                        psVar14 = psVar20;
                        if (lVar22 != 2) goto LAB_00120409;
                      }
                      uVar9 = local_2a8;
                      psVar20 = psVar20 + -1;
                      bVar4 = __gnu_cxx::__ops::
                              _Iter_pred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/roboception[P]cvkit/gimage/view.cc:601:32)>
                              ::anon_class_8_1_898f2789_for__M_pred::operator()
                                        ((anon_class_8_1_898f2789_for__M_pred *)&flist,psVar20);
                      psVar13 = psVar14;
                      if (bVar4) goto LAB_00120409;
                    }
                    bVar4 = __gnu_cxx::__ops::
                            _Iter_pred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/roboception[P]cvkit/gimage/view.cc:601:32)>
                            ::anon_class_8_1_898f2789_for__M_pred::operator()
                                      ((anon_class_8_1_898f2789_for__M_pred *)&flist,psVar20 + -1);
                    psVar13 = psVar19;
                    if (bVar4) {
                      psVar13 = psVar20;
                    }
                    goto LAB_00120409;
                  }
                  psVar13 = (string *)(lVar16 + -0x20 + lVar15);
                  bVar4 = __gnu_cxx::__ops::
                          _Iter_pred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/roboception[P]cvkit/gimage/view.cc:601:32)>
                          ::anon_class_8_1_898f2789_for__M_pred::operator()
                                    ((anon_class_8_1_898f2789_for__M_pred *)&flist,psVar13);
                  if (bVar4) {
                    psVar13 = (string *)(lVar15 + lVar16);
                    uVar9 = local_2a8;
                    goto LAB_00120409;
                  }
                  psVar20 = (string *)(lVar16 + -0x40 + lVar15);
                  bVar4 = __gnu_cxx::__ops::
                          _Iter_pred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/roboception[P]cvkit/gimage/view.cc:601:32)>
                          ::anon_class_8_1_898f2789_for__M_pred::operator()
                                    ((anon_class_8_1_898f2789_for__M_pred *)&flist,psVar20);
                  uVar9 = local_2a8;
                  if ((bVar4) ||
                     (bVar4 = __gnu_cxx::__ops::
                              _Iter_pred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/roboception[P]cvkit/gimage/view.cc:601:32)>
                              ::anon_class_8_1_898f2789_for__M_pred::operator()
                                        ((anon_class_8_1_898f2789_for__M_pred *)&flist,
                                         (string *)(lVar16 + -0x60 + lVar15)), uVar9 = local_2a8,
                     psVar13 = psVar20, bVar4)) goto LAB_00120409;
                  bVar4 = __gnu_cxx::__ops::
                          _Iter_pred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/roboception[P]cvkit/gimage/view.cc:601:32)>
                          ::anon_class_8_1_898f2789_for__M_pred::operator()
                                    ((anon_class_8_1_898f2789_for__M_pred *)&flist,
                                     (string *)(lVar16 + -0x80 + lVar15));
                  lVar22 = lVar16 + -0x80;
                  lVar18 = lVar18 + -1;
                } while (!bVar4);
                psVar13 = (string *)(lVar16 + -0x60 + lVar15);
                uVar9 = local_2a8;
LAB_00120409:
                lVar15 = (long)psVar13 -
                         (long)(anonymous_namespace)::getTextureNameRating(std::__cxx11::string)::
                               whitelist_abi_cxx11_ >> 5;
                if (lVar15 < 1) {
                  lVar15 = 0;
                }
                iVar5 = (int)lVar15;
              }
              std::__cxx11::string::~string((string *)&local_150);
              if (iVar5 <= (int)local_280) goto LAB_001201bd;
              std::__cxx11::string::_M_assign((string *)local_298);
            }
            else {
LAB_001201bd:
              uVar9 = local_2b8 & 0xffffffff;
              iVar5 = (int)local_280;
            }
            local_2b8 = uVar9 & 0xffffffff;
            local_280 = (char *)CONCAT44(local_280._4_4_,iVar5);
          }
          std::__cxx11::string::~string((string *)&h);
        }
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&s);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&depthname);
        uVar21 = uVar21 + 1;
      }
      std::__cxx11::string::~string((string *)&w);
    }
  }
  if ((char)local_28c != '\0') {
    if (local_298->_M_string_length == 0) {
      poVar8 = std::operator<<((ostream *)&std::cout,"No texture image found");
    }
    else {
      poVar8 = std::operator<<((ostream *)&std::cout,"Using texture image: ");
      poVar8 = std::operator<<(poVar8,(string *)local_298);
    }
    std::endl<char,std::char_traits<char>>(poVar8);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&list);
  return (int)local_2b8;
}

Assistant:

int getViewImageName(std::string &image, const char *name, const char *spath,
                     bool verbose)
{
  int rating=-1;
  int ret=0;

  // get image name from specification

  std::vector<std::string> list;

  gutil::split(list, name, ',');

  image.clear();

  for (size_t i=1; i<list.size(); i++)
  {
    if (list[i].compare(0, 2, "i=") == 0)
    {
      image=list[i].substr(2);
      ret=1;
    }
  }

  // support format of Middlebury stereo benchmark data sets

  if (image.size() == 0)
  {
    std::string depthname=list[0];
    size_t pos;

    pos=depthname.find_last_of("/\\");

    if (pos == depthname.npos)
    {
      pos=0;
    }
    else
    {
      pos++;
    }

    if (depthname.size()-pos >= 9 && depthname.substr(pos, 4) == "disp")
    {
      long dw, dh;
      int  dd;

      getImageIO().loadHeader(depthname.c_str(), dw, dh, dd);

      // get list of all files with that prefix

      std::set<std::string> flist;

      try
      {
        gutil::getFileList(flist, depthname.substr(0, pos)+"im"+depthname[pos+4]+".", "");
      }
      catch (gutil::IOException &)
      { }

      // check list of files for images with the same size as the depth
      // image

      for (std::set<std::string>::iterator it=flist.begin(); it!=flist.end(); ++it)
      {
        std::string s=*it;

        // try to load image header and compare size to depth image

        try
        {
          long w, h;
          int  d;

          getImageIO().loadHeader(s.c_str(), w, h, d);

          int ds=(w+dw-1)/dw;
          if ((w+ds-1)/ds == dw && (h+ds-1)/ds == dh)
          {
            if (verbose)
            {
              std::cout << "Found suitable image: " << s << std::endl;
            }

            if (dd == 1)
            {
              image=s;
              dd=d;
              ret=ds;
            }
          }
        }
        catch (const gutil::Exception &)
        { }
      }
    }
  }

  // alternatively, search for image name

  if (image.size() == 0)
  {
    std::string depthname=list[0];
    bool tiled=false;

    size_t pos=depthname.rfind(':');

    if (pos != depthname.npos && depthname.compare(pos, 2, ":\\") != 0)
    {
      tiled=true;
    }

    long dw, dh;
    int  dd;

    getImageIO().loadHeader(depthname.c_str(), dw, dh, dd);
    dd=0;

    // go through list of prefixes

    list.clear();
    getPrefixAlternatives(list, depthname, spath);

    for (size_t i=0; i<list.size() && image.size() == 0; i++)
    {
      // get list of all files with that prefix

      std::set<std::string> flist;

      try
      {
        gutil::getFileList(flist, list[i], "");
      }
      catch (gutil::IOException &)
      { }

      // check list of files for images with the same size as the depth
      // image and prefer color images

      std::set<std::string> checked;
      checked.insert(depthname);

      for (std::set<std::string>::iterator it=flist.begin(); it!=flist.end(); ++it)
      {
        std::string s=*it;

        // if the depth image is a tiled image, then try to detect the
        // corresponding image as tiled

        if (tiled)
        {
          size_t pos=s.find_last_of("/\\");

          if (pos == s.npos)
          {
            pos=0;
          }

          pos=s.find('_', pos);

          if (pos != s.npos)
          {
            size_t pos2=s.rfind('_');

            if (pos2 > pos)
            {
              s=s.substr(0, pos)+":"+s.substr(pos2+1);
            }
          }
        }

        // try to load image header and compare size to depth image

        if (checked.find(s) == checked.end() &&
            s.compare(s.size()-4, 4, ".txt") != 0 &&
            s.compare(s.size()-4, 4, ".TXT") != 0)
        {
          checked.insert(s);

          try
          {
            long w, h;
            int  d;

            getImageIO().loadHeader(s.c_str(), w, h, d);

            int ds=(w+dw-1)/dw;
            if ((w+ds-1)/ds == dw && (h+ds-1)/ds == dh)
            {
              if (verbose)
              {
                std::cout << "Found suitable image: " << s << std::endl;
              }

              int r=getTextureNameRating(s.substr(list[i].size()));
              if (r > rating)
              {
                image=s;
                rating=r;
                ret=ds;
              }
            }
          }
          catch (const gutil::Exception &)
          { }
        }
      }
    }
  }

  if (verbose)
  {
    if (image.size() > 0)
    {
      std::cout << "Using texture image: " << image << std::endl;
    }
    else
    {
      std::cout << "No texture image found" << std::endl;
    }
  }

  return ret;
}